

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomNumberGenerator.cc
# Opt level: O2

double __thiscall OpenMesh::RandomNumberGenerator::getRand(RandomNumberGenerator *this)

{
  int iVar1;
  uint i;
  ulong uVar2;
  double dVar3;
  
  dVar3 = 0.0;
  for (uVar2 = 0; uVar2 < this->iterations_; uVar2 = (ulong)((int)uVar2 + 1)) {
    iVar1 = rand();
    dVar3 = dVar3 * 2147483648.0 + (double)iVar1;
  }
  return dVar3 / this->maxNum_;
}

Assistant:

double RandomNumberGenerator::getRand() const {
  double randNum = 0.0;
  for ( unsigned int i = 0 ; i < iterations_; ++i ) {
    randNum *= (RAND_MAX + 1.0);
    randNum += rand();
  }

  return randNum / maxNum_;
}